

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFFEmbeddedFontWriter.cpp
# Opt level: O2

Byte __thiscall
CFFEmbeddedFontWriter::GetMostCompressedOffsetSize
          (CFFEmbeddedFontWriter *this,unsigned_long inOffset)

{
  Byte BVar1;
  
  BVar1 = '\x01';
  if ((0xff < inOffset) && (BVar1 = '\x02', 0xffff < inOffset)) {
    BVar1 = '\x04' - (inOffset < 0x1000000);
  }
  return BVar1;
}

Assistant:

Byte CFFEmbeddedFontWriter::GetMostCompressedOffsetSize(unsigned long inOffset)
{
	if(inOffset < 256)
		return 1;
	
	if(inOffset < 65536)
		return 2;

	if(inOffset < 1<<24)
		return 3;

	return 4;
}